

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

Result __thiscall
presolve::HPresolve::checkLimits(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  double dVar1;
  value_type vVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  size_t sVar8;
  reference pvVar9;
  undefined8 uVar10;
  ulong *in_RSI;
  long *in_RDI;
  Result __result;
  bool row_bound_change;
  bool col_bound_change;
  HighsInt check_row;
  HighsInt check_col;
  bool debug_report;
  size_t numreductions;
  HPresolve *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  Result local_4;
  
  sVar8 = HighsPostsolveStack::numReductions((HighsPostsolveStack *)0x6fa751);
  bVar3 = false;
  uVar6 = debugGetCheckCol((HPresolve *)
                           CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  uVar7 = debugGetCheckRow((HPresolve *)
                           CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  bVar4 = false;
  bVar5 = false;
  if ((-1 < (int)uVar6) || (-1 < (int)uVar7)) {
    if (-1 < (int)uVar6) {
      bVar4 = true;
      if (sVar8 != 1) {
        dVar1 = (double)in_RSI[1];
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x20),
                            (long)(int)uVar6);
        bVar4 = true;
        if ((dVar1 == *pvVar9) && (!NAN(dVar1) && !NAN(*pvVar9))) {
          dVar1 = (double)in_RSI[2];
          pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x38),
                              (long)(int)uVar6);
          bVar4 = dVar1 != *pvVar9;
        }
      }
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x20),
                          (long)(int)uVar6);
      in_RSI[1] = (ulong)*pvVar9;
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x38),
                          (long)(int)uVar6);
      in_RSI[2] = (ulong)*pvVar9;
    }
    if (-1 < (int)uVar7) {
      bVar5 = true;
      if (sVar8 != 1) {
        dVar1 = (double)in_RSI[3];
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x50),
                            (long)(int)uVar7);
        bVar5 = true;
        if ((dVar1 == *pvVar9) && (!NAN(dVar1) && !NAN(*pvVar9))) {
          dVar1 = (double)in_RSI[4];
          pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x68),
                              (long)(int)uVar7);
          bVar5 = dVar1 != *pvVar9;
        }
      }
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x50),
                          (long)(int)uVar7);
      in_RSI[3] = (ulong)*pvVar9;
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x68),
                          (long)(int)uVar7);
      in_RSI[4] = (ulong)*pvVar9;
    }
    bVar3 = *in_RSI < sVar8;
  }
  if (((-1 < (int)uVar6) && (bVar4)) && (bVar3)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(*in_RDI + 0x148),(long)(int)uVar6);
    uVar10 = std::__cxx11::string::c_str();
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x20),(long)(int)uVar6
                       );
    vVar2 = *pvVar9;
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x38),(long)(int)uVar6
                       );
    printf("After reduction %4d: col = %4d[%s] has bounds [%11.4g, %11.4g]\n",vVar2,*pvVar9,
           (ulong)((int)sVar8 - 1),(ulong)uVar6,uVar10);
    *in_RSI = sVar8;
  }
  if (((-1 < (int)uVar7) && (bVar5)) && (bVar3)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(*in_RDI + 0x160),(long)(int)uVar7);
    uVar10 = std::__cxx11::string::c_str();
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x50),(long)(int)uVar7
                       );
    vVar2 = *pvVar9;
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x68),(long)(int)uVar7
                       );
    printf("After reduction %4d: row = %4d[%s] has bounds [%11.4g, %11.4g]\n",vVar2,*pvVar9,
           (ulong)((int)sVar8 - 1),(ulong)uVar7,uVar10);
    *in_RSI = sVar8;
  }
  if ((((sVar8 & 0x3ff) != 0) ||
      (local_4 = checkTimeLimit(in_stack_ffffffffffffff58), local_4 == kOk)) &&
     (local_4 = kOk, (ulong)in_RDI[0xb2] <= sVar8)) {
    local_4 = kStopped;
  }
  return local_4;
}

Assistant:

HPresolve::Result HPresolve::checkLimits(HighsPostsolveStack& postsolve_stack) {
  size_t numreductions = postsolve_stack.numReductions();

  bool debug_report = false;
  HighsInt check_col = debugGetCheckCol();
  HighsInt check_row = debugGetCheckRow();
  bool col_bound_change = false;
  bool row_bound_change = false;
  if (check_col >= 0 || check_row >= 0) {
    if (check_col >= 0) {
      col_bound_change =
          numreductions == 1 ||
          postsolve_stack.debug_prev_col_lower !=
              model->col_lower_[check_col] ||
          postsolve_stack.debug_prev_col_upper != model->col_upper_[check_col];
      postsolve_stack.debug_prev_col_lower = model->col_lower_[check_col];
      postsolve_stack.debug_prev_col_upper = model->col_upper_[check_col];
    }
    if (check_row >= 0) {
      row_bound_change =
          numreductions == 1 ||
          postsolve_stack.debug_prev_row_lower !=
              model->row_lower_[check_row] ||
          postsolve_stack.debug_prev_row_upper != model->row_upper_[check_row];
      postsolve_stack.debug_prev_row_lower = model->row_lower_[check_row];
      postsolve_stack.debug_prev_row_upper = model->row_upper_[check_row];
    }
    debug_report = numreductions > postsolve_stack.debug_prev_numreductions;
  }
  if (check_col >= 0 && col_bound_change && debug_report) {
    printf("After reduction %4d: col = %4d[%s] has bounds [%11.4g, %11.4g]\n",
           static_cast<int>(numreductions - 1), static_cast<int>(check_col),
           model->col_names_[check_col].c_str(), model->col_lower_[check_col],
           model->col_upper_[check_col]);
    postsolve_stack.debug_prev_numreductions = numreductions;
  }
  if (check_row >= 0 && row_bound_change && debug_report) {
    printf("After reduction %4d: row = %4d[%s] has bounds [%11.4g, %11.4g]\n",
           static_cast<int>(numreductions - 1), static_cast<int>(check_row),
           model->row_names_[check_row].c_str(), model->row_lower_[check_row],
           model->row_upper_[check_row]);
    postsolve_stack.debug_prev_numreductions = numreductions;
  }

  if ((numreductions & 1023u) == 0) HPRESOLVE_CHECKED_CALL(checkTimeLimit());

  return numreductions >= reductionLimit ? Result::kStopped : Result::kOk;
}